

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPTCPTransmitter::RTPTCPTransmitter(RTPTCPTransmitter *this,RTPMemoryManager *mgr)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject.mgr = mgr;
  timeinit = timeinit + 1;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPTCPTransmitter_0013c668;
  p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_localHostname).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_localHostname).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_localHostname).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_rawpacketlist;
  (this->m_rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_rawpacketlist;
  (this->m_rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node._M_size = 0;
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->m_init = false;
  this->m_created = false;
  return;
}

Assistant:

RTPTCPTransmitter::RTPTCPTransmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr)
{
	m_created = false;
	m_init = false;
}